

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAppendCones(Gia_Man_t *p,Gia_Man_t **ppCones,int nCones,int fOnlyRegs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_84;
  int local_40;
  int local_3c;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  int fOnlyRegs_local;
  int nCones_local;
  Gia_Man_t **ppCones_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (local_3c < iVar1) {
      _k = Gia_ManCi(p,local_3c);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p_00);
    _k->Value = uVar3;
    local_3c = local_3c + 1;
  }
  local_3c = 0;
  while( true ) {
    bVar7 = false;
    if (local_3c < p->nObjs) {
      _k = Gia_ManObj(p,local_3c);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_k);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_k);
      iVar2 = Gia_ObjFanin1Copy(_k);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      _k->Value = uVar3;
    }
    local_3c = local_3c + 1;
  }
  local_3c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar7 = false;
    if (local_3c < iVar1) {
      _k = Gia_ManCo(p,local_3c);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(_k);
    uVar3 = Gia_ManAppendCo(p_00,iVar1);
    _k->Value = uVar3;
    local_3c = local_3c + 1;
  }
  local_40 = 0;
  while( true ) {
    if (nCones <= local_40) {
      local_3c = 0;
      while( true ) {
        iVar1 = Gia_ManRegNum(p);
        bVar7 = false;
        if (local_3c < iVar1) {
          iVar1 = Gia_ManPoNum(p);
          _k = Gia_ManCo(p,iVar1 + local_3c);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjFanin0Copy(_k);
        uVar3 = Gia_ManAppendCo(p_00,iVar1);
        _k->Value = uVar3;
        local_3c = local_3c + 1;
      }
      Gia_ManHashStop(p_00);
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      pGVar6 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar6;
    }
    pGVar6 = ppCones[local_40];
    iVar1 = Gia_ManPoNum(pGVar6);
    if (iVar1 != 1) break;
    iVar1 = Gia_ManRegNum(pGVar6);
    if (iVar1 != 0) {
      __assert_fail("Gia_ManRegNum(pOne) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x485,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
    }
    if (fOnlyRegs == 0) {
      iVar1 = Gia_ManPiNum(pGVar6);
      iVar2 = Gia_ManCiNum(p);
      if (iVar1 != iVar2) {
        __assert_fail("Gia_ManPiNum(pOne) == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x489,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
    }
    else {
      iVar1 = Gia_ManPiNum(pGVar6);
      iVar2 = Gia_ManRegNum(p);
      if (iVar1 != iVar2) {
        __assert_fail("Gia_ManPiNum(pOne) == Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x487,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)"
                     );
      }
    }
    pGVar5 = Gia_ManConst0(pGVar6);
    pGVar5->Value = 0;
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(pGVar6);
      bVar7 = false;
      if (local_3c < iVar1) {
        _k = Gia_ManCi(pGVar6,local_3c);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if (fOnlyRegs == 0) {
        local_84 = local_3c;
      }
      else {
        local_84 = Gia_ManPiNum(p);
        local_84 = local_84 + local_3c;
      }
      uVar3 = Gia_ManCiLit(p_00,local_84);
      _k->Value = uVar3;
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      bVar7 = false;
      if (local_3c < pGVar6->nObjs) {
        _k = Gia_ManObj(pGVar6,local_3c);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(_k);
        iVar2 = Gia_ObjFanin1Copy(_k);
        uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
        _k->Value = uVar3;
      }
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(pGVar6);
      bVar7 = false;
      if (local_3c < iVar1) {
        _k = Gia_ManCo(pGVar6,local_3c);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFanin0Copy(_k);
      uVar3 = Gia_ManAppendCo(p_00,iVar1);
      _k->Value = uVar3;
      local_3c = local_3c + 1;
    }
    local_40 = local_40 + 1;
  }
  __assert_fail("Gia_ManPoNum(pOne) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x484,"Gia_Man_t *Gia_ManDupAppendCones(Gia_Man_t *, Gia_Man_t **, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupAppendCones( Gia_Man_t * p, Gia_Man_t ** ppCones, int nCones, int fOnlyRegs )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    for ( k = 0; k < nCones; k++ )
    {
        pOne = ppCones[k];
        assert( Gia_ManPoNum(pOne) == 1 );
        assert( Gia_ManRegNum(pOne) == 0 );
        if ( fOnlyRegs )
            assert( Gia_ManPiNum(pOne) == Gia_ManRegNum(p) );
        else
            assert( Gia_ManPiNum(pOne) == Gia_ManCiNum(p) );
        Gia_ManConst0(pOne)->Value = 0;
        Gia_ManForEachPi( pOne, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, fOnlyRegs ? Gia_ManPiNum(p) + i : i );
        Gia_ManForEachAnd( pOne, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( pOne, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}